

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

void Abc_TtMakePosUnate(word *t,int nVars)

{
  word wVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  word *pLimit;
  word *pwVar9;
  word *pwVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  word *tLimit;
  ulong uVar14;
  
  if (nVars < 1) {
    return;
  }
  iVar7 = nVars + -6;
  uVar13 = 1 << ((byte)iVar7 & 0x1f);
  uVar2 = uVar13;
  if (nVars < 7) {
    uVar2 = 1;
  }
  uVar3 = uVar13;
  if ((int)uVar13 < 2) {
    uVar3 = 1;
  }
  uVar8 = 0;
LAB_007bc15b:
  bVar6 = (byte)uVar8;
  if (nVars < 7) {
    uVar12 = *t;
    bVar5 = (byte)(1 << (bVar6 & 0x1f));
    if ((~(uVar12 << (bVar5 & 0x3f)) & s_Truths6[uVar8] & uVar12) == 0) goto LAB_007bc207;
    if ((~(uVar12 >> (bVar5 & 0x3f)) & s_Truths6Neg[uVar8] & uVar12) != 0) {
LAB_007bc431:
      __assert_fail("Abc_TtPosVar(t, nVars, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x6f2,"void Abc_TtMakePosUnate(word *, int)");
    }
  }
  else {
    if (uVar8 < 6) {
      if (iVar7 != 0x1f) {
        uVar12 = 0;
        do {
          if ((~(t[uVar12] << ((byte)(1 << (bVar6 & 0x1f)) & 0x3f)) & s_Truths6[uVar8] & t[uVar12])
              != 0) goto LAB_007bc364;
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
      }
    }
    else if (iVar7 != 0x1f) {
      bVar5 = (byte)(uVar8 - 6);
      uVar4 = 1 << (bVar5 & 0x1f);
      iVar11 = 2 << (bVar5 & 0x1f);
      uVar12 = 1;
      if (1 < (int)uVar4) {
        uVar12 = (ulong)uVar4;
      }
      pwVar10 = t + (int)uVar4;
      pwVar9 = t;
      do {
        if (uVar8 - 6 != 0x1f) {
          uVar14 = 0;
          do {
            if ((pwVar10[uVar14] & ~pwVar9[uVar14]) != 0) goto LAB_007bc364;
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        pwVar9 = pwVar9 + iVar11;
        pwVar10 = pwVar10 + iVar11;
      } while (pwVar9 < t + (int)uVar13);
    }
LAB_007bc207:
    if (uVar2 == 1) {
      bVar6 = (byte)(1 << (bVar6 & 0x1f));
      *t = (s_Truths6[uVar8] & *t) >> (bVar6 & 0x3f) | *t << (bVar6 & 0x3f) & s_Truths6[uVar8];
    }
    else if (uVar8 < 6) {
      if (0 < (int)uVar2) {
        uVar12 = s_Truths6[uVar8];
        uVar14 = 0;
        do {
          bVar5 = (byte)(1 << (bVar6 & 0x1f));
          t[uVar14] = (t[uVar14] & uVar12) >> (bVar5 & 0x3f) | t[uVar14] << (bVar5 & 0x3f) & uVar12;
          uVar14 = uVar14 + 1;
        } while (uVar2 != uVar14);
      }
    }
    else if (0 < (int)uVar2) {
      bVar6 = (byte)(uVar8 - 6);
      uVar4 = 1 << (bVar6 & 0x1f);
      iVar11 = 2 << (bVar6 & 0x1f);
      uVar12 = 1;
      if (1 < (int)uVar4) {
        uVar12 = (ulong)uVar4;
      }
      pwVar10 = t + (int)uVar4;
      pwVar9 = t;
      do {
        if (uVar8 - 6 != 0x1f) {
          uVar14 = 0;
          do {
            wVar1 = pwVar9[uVar14];
            pwVar9[uVar14] = pwVar10[uVar14];
            pwVar10[uVar14] = wVar1;
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        pwVar9 = pwVar9 + iVar11;
        pwVar10 = pwVar10 + iVar11;
      } while (pwVar9 < t + (int)uVar2);
    }
  }
  goto LAB_007bc414;
LAB_007bc364:
  if (uVar8 < 6) {
    if (iVar7 != 0x1f) {
      uVar12 = 0;
      do {
        if ((~(t[uVar12] >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f)) & s_Truths6Neg[uVar8] & t[uVar12])
            != 0) goto LAB_007bc431;
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
  }
  else if (iVar7 != 0x1f) {
    bVar6 = (byte)(uVar8 - 6);
    uVar4 = 1 << (bVar6 & 0x1f);
    iVar11 = 2 << (bVar6 & 0x1f);
    uVar12 = 1;
    if (1 < (int)uVar4) {
      uVar12 = (ulong)uVar4;
    }
    pwVar10 = t + (int)uVar4;
    pwVar9 = t;
    do {
      if (uVar8 - 6 != 0x1f) {
        uVar14 = 0;
        do {
          if ((pwVar9[uVar14] & ~pwVar10[uVar14]) != 0) goto LAB_007bc431;
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      pwVar9 = pwVar9 + iVar11;
      pwVar10 = pwVar10 + iVar11;
    } while (pwVar9 < t + (int)uVar13);
  }
LAB_007bc414:
  uVar8 = uVar8 + 1;
  if (uVar8 == (uint)nVars) {
    return;
  }
  goto LAB_007bc15b;
}

Assistant:

static inline void Abc_TtMakePosUnate( word * t, int nVars )
{
    int i, nWords = Abc_TtWordNum(nVars);
    for ( i = 0; i < nVars; i++ )
        if ( Abc_TtNegVar(t, nVars, i) )
            Abc_TtFlip( t, nWords, i );
        else assert( Abc_TtPosVar(t, nVars, i) );
}